

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void cume_distStepFunc(sqlite3_context *pCtx,int nArg,sqlite3_value **apArg)

{
  void *pvVar1;
  sqlite3_int64 sVar2;
  CallCount *p;
  sqlite3_context *in_stack_ffffffffffffffd8;
  
  pvVar1 = sqlite3_aggregate_context(in_stack_ffffffffffffffd8,0);
  if (pvVar1 != (void *)0x0) {
    if (*(long *)((long)pvVar1 + 0x10) == 0) {
      sVar2 = sqlite3_value_int64((sqlite3_value *)0x1e0057);
      *(sqlite3_int64 *)((long)pvVar1 + 0x10) = sVar2;
    }
    *(long *)((long)pvVar1 + 8) = *(long *)((long)pvVar1 + 8) + 1;
  }
  return;
}

Assistant:

static void cume_distStepFunc(
  sqlite3_context *pCtx, 
  int nArg,
  sqlite3_value **apArg
){
  struct CallCount *p;
  assert( nArg==1 ); UNUSED_PARAMETER(nArg);

  p = (struct CallCount*)sqlite3_aggregate_context(pCtx, sizeof(*p));
  if( p ){
    if( p->nTotal==0 ){
      p->nTotal = sqlite3_value_int64(apArg[0]);
    }
    p->nStep++;
  }
}